

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O2

void __thiscall despot::Parser::Parser(Parser *this)

{
  _Rb_tree_header *p_Var1;
  
  (this->file_name_)._M_dataplus._M_p = (pointer)&(this->file_name_).field_2;
  (this->file_name_)._M_string_length = 0;
  (this->file_name_).field_2._M_local_buf[0] = '\0';
  (this->variables_)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->variables_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  p_Var1 = &(this->variables_)._M_t._M_impl.super__Rb_tree_header;
  (this->variables_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->variables_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  memset(&(this->variables_)._M_t._M_impl.super__Rb_tree_header._M_node_count,0,0x140);
  this->enable_selfloop_cache_ = true;
  (this->selfloop_state_set_)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->selfloop_state_set_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  p_Var1 = &(this->selfloop_state_set_)._M_t._M_impl.super__Rb_tree_header;
  (this->selfloop_state_set_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->selfloop_state_set_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->selfloop_state_set_)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  std::
  queue<std::vector<int,std::allocator<int>>,std::deque<std::vector<int,std::allocator<int>>,std::allocator<std::vector<int,std::allocator<int>>>>>
  ::
  queue<std::deque<std::vector<int,std::allocator<int>>,std::allocator<std::vector<int,std::allocator<int>>>>,void>
            (&this->selfloop_state_queue_);
  (this->is_identity_).
  super__Vector_base<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->is_identity_).
  super__Vector_base<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->is_identity_).
  super__Vector_base<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  return;
}

Assistant:

Parser::Parser() :
	enable_selfloop_cache_(true) {
}